

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLGeometryLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::GeometryLoader::begin__spline
          (GeometryLoader *this,spline__AttributeData *attributeData)

{
  COLLADAVersion CVar1;
  IFilePartLoader *pIVar2;
  IParserImpl *pIVar3;
  IFilePartLoader *in_RDI;
  SplineLoader14 *splineloader14;
  String *in_stack_00000040;
  IFilePartLoader *in_stack_00000048;
  SplineLoader *in_stack_ffffffffffffff98;
  SplineLoader14 *in_stack_ffffffffffffffa0;
  IParserImpl *local_58;
  
  pIVar2 = (IFilePartLoader *)operator_new(0x138);
  SplineLoader::SplineLoader
            ((SplineLoader *)attributeData,in_stack_00000048,in_stack_00000040,
             (String *)splineloader14);
  in_RDI[4].mPartLoader = pIVar2;
  IFilePartLoader::setPartLoader(in_RDI,in_RDI[4].mPartLoader);
  pIVar3 = IFilePartLoader::getParserImpl(in_RDI);
  CVar1 = IParserImpl::getCOLLADAVersion(pIVar3);
  if (CVar1 == COLLADA_14) {
    pIVar3 = (IParserImpl *)operator_new(0x28);
    SplineLoader14::SplineLoader14(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    IFilePartLoader::setParserImpl(in_RDI[4].mPartLoader,pIVar3);
    local_58 = (IParserImpl *)0x0;
    if (pIVar3 != (IParserImpl *)0x0) {
      local_58 = pIVar3 + 1;
    }
    (*(in_RDI->super_ExtraDataLoader)._vptr_ExtraDataLoader[9])(in_RDI,local_58);
  }
  else if (CVar1 == COLLADA_15) {
    return false;
  }
  return true;
}

Assistant:

bool GeometryLoader::begin__spline(const spline__AttributeData & attributeData)
    {
        mSplineLoader = new SplineLoader(this, mGeometryId, mGeometryName);
        setPartLoader(mSplineLoader);
        switch (this->getParserImpl()->getCOLLADAVersion())
        {
        case COLLADA_14:
            {
                SplineLoader14* splineloader14 = new SplineLoader14( mSplineLoader );
                mSplineLoader->setParserImpl(splineloader14);
                setParser(splineloader14);
                break;
            }
        case COLLADA_15:
            {
                return false;
                break;
            }
        default:
            break;
        }
        return true;
    }